

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateState
          (HtmlparserCppTest *this,string *expected_state)

{
  char *pcVar1;
  char *__lhs;
  __type _Var2;
  int enum_id;
  ulong uVar3;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  char *parsed_state;
  string *expected_state_local;
  HtmlparserCppTest *this_local;
  
  parsed_state = (char *)expected_state;
  expected_state_local = (string *)this;
  enum_id = HtmlParser::state(&this->parser_);
  local_20 = IdToName(this,(IdNameMap *)kStateMap,enum_id);
  if (local_20 == (char *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","parsed_state != __null");
    exit(1);
  }
  uVar3 = std::__cxx11::string::empty();
  __lhs = parsed_state;
  pcVar1 = local_20;
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar1,&local_41);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (((_Var2 ^ 0xffU) & 1) == 0) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_state","==","string(parsed_state)");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","!expected_state.empty()");
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateState(const string &expected_state) {
  const char* parsed_state = IdToName(kStateMap, parser_.state());
  EXPECT_TRUE(parsed_state != NULL);
  EXPECT_TRUE(!expected_state.empty());
  EXPECT_EQ(expected_state, string(parsed_state))
      << "Unexpected state at line " << parser_.line_number();
}